

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pospopcnt.c
# Opt level: O2

pospopcnt_u32_method_type get_pospopcnt_u32_method(PPOPCNT_U32_METHODS method)

{
  if (method < PPOPCNT_U32_NUMBER_METHODS) {
    return (pospopcnt_u32_method_type)(&PTR_pospopcnt_u32_scalar_naive_00118dc8)[method];
  }
  return (pospopcnt_u32_method_type)0x0;
}

Assistant:

pospopcnt_u32_method_type get_pospopcnt_u32_method(PPOPCNT_U32_METHODS method) {
    switch(method) {
    case PPOPCNT_U32_AUTO: return pospopcnt_u32_scalar_naive; /* TODO: implement something similar to pospopcnt_u16 */
    case PPOPCNT_U32_SCALAR: return pospopcnt_u32_scalar_naive;
    case PPOPCNT_U32_SSE_HARLEY_SEAL: return pospopcnt_u32_sse_harley_seal;
    case PPOPCNT_U32_SSE_HARLEY_SEAL_IMPROVED: return pospopcnt_u32_sse_harley_seal_improved;
    case PPOPCNT_U32_AVX2_HARLEY_SEAL: return pospopcnt_u32_avx2_harley_seal;
    case PPOPCNT_U32_AVX2_HARLEY_SEAL_IMPROVED: return pospopcnt_u32_avx2_harley_seal_improved;
    case PPOPCNT_U32_NUMBER_METHODS: break; /* -Wswitch */
    }
    assert(0);
    return 0; /* unreachable, but some compilers complain without it */
}